

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O2

int testNumberOfNeighborsWithInvalidRange(void)

{
  bool bVar1;
  KNearestNeighborsClassifier *this;
  Int64Parameter *this_00;
  Int64Range *pIVar2;
  NearestNeighborsIndex *this_01;
  SingleKdTreeIndex *pSVar3;
  ostream *poVar4;
  ostream *this_02;
  int iVar5;
  char *pcVar6;
  undefined1 auStack_98 [40];
  Result res;
  Model m1;
  
  CoreML::Specification::Model::Model(&m1);
  CoreML::KNNValidatorTests::generateInterface(&m1);
  this = CoreML::Specification::Model::mutable_knearestneighborsclassifier(&m1);
  this_00 = CoreML::Specification::KNearestNeighborsClassifier::mutable_numberofneighbors(this);
  pIVar2 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
  pIVar2->minvalue_ = -1;
  pIVar2 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
  pIVar2->maxvalue_ = 10;
  this_00->defaultvalue_ = 5;
  CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting(this);
  this_01 = CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex(this);
  CoreML::Specification::NearestNeighborsIndex::mutable_squaredeuclideandistance(this_01);
  pSVar3 = CoreML::Specification::NearestNeighborsIndex::mutable_singlekdtreeindex(this_01);
  pSVar3->leafsize_ = 0x1e;
  CoreML::Specification::KNearestNeighborsClassifier::set_defaultstringlabel(this,"Default");
  CoreML::validate<(MLModelType)404>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    this_02 = (ostream *)std::operator<<(poVar4,":");
    iVar5 = 0x238;
LAB_0013666c:
    poVar4 = (ostream *)std::ostream::operator<<(this_02,iVar5);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar6 = "!((res).good())";
  }
  else {
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
    pIVar2->minvalue_ = 0;
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
    pIVar2->maxvalue_ = 10;
    this_00->defaultvalue_ = 5;
    CoreML::validate<(MLModelType)404>((Result *)auStack_98,&m1);
    CoreML::Result::operator=(&res,(Result *)auStack_98);
    std::__cxx11::string::~string((string *)(auStack_98 + 8));
    bVar1 = CoreML::Result::good(&res);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                              );
      this_02 = (ostream *)std::operator<<(poVar4,":");
      iVar5 = 0x240;
      goto LAB_0013666c;
    }
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
    pIVar2->minvalue_ = 10;
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
    pIVar2->maxvalue_ = 1;
    this_00->defaultvalue_ = 5;
    CoreML::validate<(MLModelType)404>((Result *)auStack_98,&m1);
    CoreML::Result::operator=(&res,(Result *)auStack_98);
    std::__cxx11::string::~string((string *)(auStack_98 + 8));
    bVar1 = CoreML::Result::good(&res);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                              );
      this_02 = (ostream *)std::operator<<(poVar4,":");
      iVar5 = 0x248;
      goto LAB_0013666c;
    }
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
    pIVar2->minvalue_ = -10;
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
    pIVar2->maxvalue_ = -5;
    this_00->defaultvalue_ = 5;
    CoreML::validate<(MLModelType)404>((Result *)auStack_98,&m1);
    CoreML::Result::operator=(&res,(Result *)auStack_98);
    std::__cxx11::string::~string((string *)(auStack_98 + 8));
    bVar1 = CoreML::Result::good(&res);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                              );
      this_02 = (ostream *)std::operator<<(poVar4,":");
      iVar5 = 0x250;
      goto LAB_0013666c;
    }
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
    pIVar2->minvalue_ = 1;
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
    pIVar2->maxvalue_ = 10;
    this_00->defaultvalue_ = 5;
    CoreML::validate<(MLModelType)404>((Result *)auStack_98,&m1);
    CoreML::Result::operator=(&res,(Result *)auStack_98);
    std::__cxx11::string::~string((string *)(auStack_98 + 8));
    bVar1 = CoreML::Result::good(&res);
    iVar5 = 0;
    if (bVar1) goto LAB_001366ac;
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,600);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar6 = "(res).good()";
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  poVar4 = std::operator<<(poVar4," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar5 = 1;
LAB_001366ac:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return iVar5;
}

Assistant:

int testNumberOfNeighborsWithInvalidRange() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    auto *numberOfNeighbors = knnClassifier->mutable_numberofneighbors();
    numberOfNeighbors->mutable_range()->set_minvalue(-1);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(5);

    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    knnClassifier->set_defaultstringlabel("Default");

    // Validation should fail since range bounds should be > 0
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(0);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should fail since range bounds should be > 0
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(10);
    numberOfNeighbors->mutable_range()->set_maxvalue(1);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should fail since since range max should be > range min
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(-10);
    numberOfNeighbors->mutable_range()->set_maxvalue(-5);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should fail since range values must be > 0
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(1);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should now succeed
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);

    return 0;

}